

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cycles.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  int *piVar2;
  int __fd;
  int __how;
  timespec *ptVar3;
  actor_ref analizer;
  actor_ref local_28;
  timespec local_20;
  
  __fd = (int)&local_28;
  acto::spawn<Analizer>((acto *)&local_28,exclusive);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Statistic is being collected.",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please wait some seconds...",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  if (local_28.object_ != (object_t *)0x0) {
    local_20.tv_sec = (__time_t)operator_new(0x20);
    *(long *)(local_20.tv_sec + 8) = 0;
    *(pointer_____offset_0x10___ **)(local_20.tv_sec + 0x10) = &msg_start::typeinfo;
    *(long *)(local_20.tv_sec + 0x18) = 0;
    *(undefined ***)local_20.tv_sec = &PTR__msg_t_0010e6e0;
    acto::actor_ref::send_message
              (&local_28,
               (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)&local_20);
    if ((long *)local_20.tv_sec != (long *)0x0) {
      (**(code **)(*(long *)local_20.tv_sec + 8))();
    }
  }
  local_20.tv_sec = 5;
  local_20.tv_nsec = 0;
  do {
    ptVar3 = &local_20;
    iVar1 = nanosleep(&local_20,&local_20);
    __how = (int)ptVar3;
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (local_28.object_ != (object_t *)0x0) {
    local_20.tv_sec = (__time_t)operator_new(0x20);
    *(long *)(local_20.tv_sec + 8) = 0;
    *(pointer_____offset_0x10___ **)(local_20.tv_sec + 0x10) = &msg_stop::typeinfo;
    *(long *)(local_20.tv_sec + 0x18) = 0;
    *(undefined ***)local_20.tv_sec = &PTR__msg_t_0010e770;
    ptVar3 = &local_20;
    acto::actor_ref::send_message
              (&local_28,
               (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)ptVar3);
    __how = (int)ptVar3;
    if ((long *)local_20.tv_sec != (long *)0x0) {
      (**(code **)(*(long *)local_20.tv_sec + 8))();
    }
    local_20.tv_sec = 0;
  }
  acto::join(&local_28);
  acto::actor_ref::~actor_ref(&local_28);
  acto::shutdown(__fd,__how);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":end",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
  {
    acto::actor_ref analizer = acto::spawn< Analizer >(acto::actor_thread::exclusive);
    // -
    std::cout << "Statistic is being collected." << std::endl;
    std::cout << "Please wait some seconds..." << std::endl;
    // Запустить выполнение примера
    analizer.send(msg_start());

    acto::this_thread::sleep_for(std::chrono::seconds(5));
    // Оставноваить выполнение и собрать статистику
    analizer.send(msg_stop());

    acto::join(analizer);
  }
  // Освободить ресурсы
  acto::shutdown();

  std::cout << ":end" << std::endl;

#ifdef ACTO_WIN
  _getch();
#endif

  return 0;
}